

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileProfilingData.cxx
# Opt level: O2

void __thiscall cmMakefileProfilingData::~cmMakefileProfilingData(cmMakefileProfilingData *this)

{
  if (*(int *)(&(this->ProfileStream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x20
              + (long)(this->ProfileStream).super_basic_ostream<char,_std::char_traits<char>_>.
                      _vptr_basic_ostream[-3]) == 0) {
    std::operator<<((ostream *)this,"]");
    std::ofstream::close();
  }
  std::unique_ptr<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>::~unique_ptr
            (&this->JsonWriter);
  std::ofstream::~ofstream(this);
  return;
}

Assistant:

cmMakefileProfilingData::~cmMakefileProfilingData() noexcept
{
  if (this->ProfileStream.good()) {
    try {
      this->ProfileStream << "]";
      this->ProfileStream.close();
    } catch (...) {
      cmSystemTools::Error("Error writing profiling output!");
    }
  }
}